

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::SystemIdentifier::SystemIdentifier(SystemIdentifier *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SystemIdentifier_00218af0;
  this->m_ui16SystemType = 0;
  this->m_ui16SystemName = 0;
  this->m_ui8SystemMode = '\0';
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xf8;
  return;
}

Assistant:

SystemIdentifier::SystemIdentifier() :
    m_ui16SystemType( 0 ),
    m_ui16SystemName( 0 ),
    m_ui8SystemMode( 0 ),
    m_ui8ChangeIndicator( 0 ),
    m_ui8AltMode4( 0 ),
    m_ui8AltModeC( 0 )
{
}